

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::param::Atlas::addMesh(Atlas *this,TaskScheduler *taskScheduler,Mesh *mesh)

{
  Task task_00;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  CreateChartGroupTaskArgs *pCVar4;
  ChartGroup **ppCVar5;
  uint16_t local_dc;
  uint32_t local_b0;
  uint local_ac;
  code *pcStack_a8;
  uint32_t g_2;
  CreateChartGroupTaskArgs *pCStack_a0;
  uint32_t local_8c;
  code *pcStack_88;
  Task task;
  uint32_t g_1;
  TaskGroupHandle taskGroup;
  CreateChartGroupTaskArgs *args;
  undefined1 local_60 [4];
  uint32_t g;
  Array<xatlas::internal::param::CreateChartGroupTaskArgs> taskArgs;
  undefined1 local_38 [8];
  Array<xatlas::internal::param::ChartGroup_*> chartGroups;
  Mesh *mesh_local;
  TaskScheduler *taskScheduler_local;
  Atlas *this_local;
  
  chartGroups.m_base._16_8_ = mesh;
  Array<xatlas::internal::param::ChartGroup_*>::Array
            ((Array<xatlas::internal::param::ChartGroup_*> *)local_38,0);
  uVar2 = Mesh::faceGroupCount((Mesh *)chartGroups.m_base._16_8_);
  uVar3 = Mesh::ignoredFaceCount((Mesh *)chartGroups.m_base._16_8_);
  Array<xatlas::internal::param::ChartGroup_*>::resize
            ((Array<xatlas::internal::param::ChartGroup_*> *)local_38,
             (uVar2 + 1) - (uint)(uVar3 == 0));
  Array<xatlas::internal::param::CreateChartGroupTaskArgs>::Array
            ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)local_60,0);
  uVar2 = Array<xatlas::internal::param::ChartGroup_*>::size
                    ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
  Array<xatlas::internal::param::CreateChartGroupTaskArgs>::resize
            ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)local_60,uVar2);
  args._4_4_ = 0;
  while( true ) {
    uVar2 = Array<xatlas::internal::param::ChartGroup_*>::size
                      ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
    if (uVar2 <= args._4_4_) break;
    pCVar4 = Array<xatlas::internal::param::CreateChartGroupTaskArgs>::operator[]
                       ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)local_60,
                        args._4_4_);
    ppCVar5 = Array<xatlas::internal::param::ChartGroup_*>::operator[]
                        ((Array<xatlas::internal::param::ChartGroup_*> *)local_38,args._4_4_);
    pCVar4->chartGroup = ppCVar5;
    uVar2 = Mesh::faceGroupCount((Mesh *)chartGroups.m_base._16_8_);
    if (args._4_4_ < uVar2) {
      local_dc = (uint16_t)args._4_4_;
    }
    else {
      local_dc = 0xffff;
    }
    pCVar4->faceGroup = local_dc;
    pCVar4->groupId = args._4_4_;
    pCVar4->mesh = (Mesh *)chartGroups.m_base._16_8_;
    args._4_4_ = args._4_4_ + 1;
  }
  uVar2 = Array<xatlas::internal::param::ChartGroup_*>::size
                    ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
  task.userData._4_4_ = TaskScheduler::createTaskGroup(taskScheduler,uVar2);
  task.userData._0_4_ = 0;
  while( true ) {
    uVar1 = (uint)task.userData;
    uVar2 = Array<xatlas::internal::param::ChartGroup_*>::size
                      ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
    if (uVar2 <= uVar1) break;
    pCStack_a0 = Array<xatlas::internal::param::CreateChartGroupTaskArgs>::operator[]
                           ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)local_60,
                            (uint)task.userData);
    pcStack_88 = runCreateChartGroupTask;
    local_8c = task.userData._4_4_;
    pcStack_a8 = runCreateChartGroupTask;
    task_00.userData = pCStack_a0;
    task_00.func = runCreateChartGroupTask;
    task.func = (_func_void_void_ptr *)pCStack_a0;
    TaskScheduler::run(taskScheduler,task.userData._4_4_,task_00);
    task.userData._0_4_ = (uint)task.userData + 1;
  }
  TaskScheduler::wait(taskScheduler,(void *)((long)&task.userData + 4));
  std::mutex::lock(&this->m_addMeshMutex);
  local_ac = 0;
  while( true ) {
    uVar1 = local_ac;
    uVar2 = Array<xatlas::internal::param::ChartGroup_*>::size
                      ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
    if (uVar2 <= uVar1) break;
    ppCVar5 = Array<xatlas::internal::param::ChartGroup_*>::operator[]
                        ((Array<xatlas::internal::param::ChartGroup_*> *)local_38,local_ac);
    Array<xatlas::internal::param::ChartGroup_*>::push_back(&this->m_chartGroups,ppCVar5);
    local_b0 = Mesh::id((Mesh *)chartGroups.m_base._16_8_);
    Array<unsigned_int>::push_back(&this->m_chartGroupSourceMeshes,&local_b0);
    local_ac = local_ac + 1;
  }
  this->m_meshCount = this->m_meshCount + 1;
  std::mutex::unlock(&this->m_addMeshMutex);
  Array<xatlas::internal::param::CreateChartGroupTaskArgs>::~Array
            ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)local_60);
  Array<xatlas::internal::param::ChartGroup_*>::~Array
            ((Array<xatlas::internal::param::ChartGroup_*> *)local_38);
  return;
}

Assistant:

void addMesh(TaskScheduler *taskScheduler, const Mesh *mesh)
	{
		// Create one chart group per face group.
		// If there's any ignored faces in the mesh, create an extra face group for that (vertex map).
		// Chart group creation is slow since it copies a chunk of the source mesh, so use tasks.
		Array<ChartGroup *> chartGroups;
		chartGroups.resize(mesh->faceGroupCount() + (mesh->ignoredFaceCount() > 0 ? 1 : 0));
		Array<CreateChartGroupTaskArgs> taskArgs;
		taskArgs.resize(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			CreateChartGroupTaskArgs &args = taskArgs[g];
			args.chartGroup = &chartGroups[g];
			args.faceGroup = uint16_t(g < mesh->faceGroupCount() ? g : Mesh::kInvalidFaceGroup);
			args.groupId = g;
			args.mesh = mesh;
		}
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			Task task;
			task.userData = &taskArgs[g];
			task.func = runCreateChartGroupTask;
			taskScheduler->run(taskGroup, task);
		}
		taskScheduler->wait(&taskGroup);
		// Thread-safe append.
		m_addMeshMutex.lock();
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			m_chartGroups.push_back(chartGroups[g]);
			m_chartGroupSourceMeshes.push_back(mesh->id());
		}
		m_meshCount++;
		m_addMeshMutex.unlock();
	}